

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxFunctionCall::Resolve(FxFunctionCall *this,FCompileContext *ctx)

{
  FArgumentList *args;
  FScriptPosition *sc;
  ENamedName EVar1;
  FName fname;
  PStruct *selfcls;
  FxExpression **ppFVar2;
  PType *type;
  PInt *pPVar3;
  FRandom *expr;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  PFunction *callee;
  FxExpression *pFVar8;
  FxVMFunctionCall *this_00;
  undefined4 extraout_var;
  PClass *pPVar10;
  FxConstant *this_01;
  FxMinMax *this_02;
  undefined8 *puVar11;
  PName **ppPVar12;
  FxExpression *pFVar13;
  FLOP *pFVar14;
  char *pcVar15;
  long lVar16;
  char *message;
  undefined8 uVar17;
  int s;
  size_t index;
  bool error;
  int max;
  TArray<FxExpression_*,_FxExpression_*> pass;
  int min;
  bool local_69;
  FRandom *local_68;
  int local_5c;
  TArray<FxExpression_*,_FxExpression_*> local_58;
  int local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  _func_int **pp_Var9;
  
  selfcls = ctx->Class;
  if (selfcls == (PStruct *)0x0) goto LAB_00532bc3;
  local_69 = false;
  uVar7 = (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar7 != 0) {
    lVar16 = 0;
    do {
      if (*(long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                   lVar16) == 0) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
        goto LAB_005321a5;
      }
      lVar16 = lVar16 + 8;
    } while (uVar7 << 3 != lVar16);
  }
  args = &this->ArgList;
  local_34.Index = (this->MethodName).Index;
  sc = &(this->super_FxExpression).ScriptPosition;
  callee = FindClassMemberFunction(selfcls,selfcls,&local_34,sc,&local_69);
  if (callee != (PFunction *)0x0) {
    bVar4 = CheckFunctionCompatiblity(sc,ctx->Function,callee);
    if (!bVar4) goto LAB_00532bc3;
    local_68 = (FRandom *)ctx;
    if ((((callee->Variants).Array)->Flags & 2) == 0) {
      pFVar8 = (FxExpression *)0x0;
    }
    else {
      pFVar8 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar8->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition(&pFVar8->ScriptPosition,sc);
      pFVar8->ValueType = (PType *)0x0;
      pFVar8->isresolved = false;
      pFVar8->NeedResult = true;
      pFVar8->ExprType = EFX_Self;
      pFVar8->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c728;
      *(undefined1 *)&pFVar8[1]._vptr_FxExpression = 0;
    }
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x68);
    FxVMFunctionCall::FxVMFunctionCall(this_00,pFVar8,callee,args,sc,false);
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var9 = (this_00->super_FxExpression)._vptr_FxExpression;
    ctx = (FCompileContext *)local_68;
    goto LAB_005322d2;
  }
  EVar1 = (this->MethodName).Index;
  pFVar14 = FxFlops;
  index = 0;
  do {
    if (EVar1 == pFVar14->Name) {
      this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
      FxFlopFunctionCall::FxFlopFunctionCall((FxFlopFunctionCall *)this_00,index,args,sc);
      goto LAB_0053222b;
    }
    index = index + 1;
    pFVar14 = pFVar14 + 1;
  } while (index != 0xf);
  local_68 = (FRandom *)args;
  if (EVar1 - NAME_ACS_NamedExecuteWithResult < 2) {
    local_48 = 1;
    local_5c = 5;
    iVar5 = -0x54;
  }
  else {
    iVar5 = P_FindLineSpecial(FName::NameData.NameArray[(int)EVar1].Text,&local_48,&local_5c);
  }
  if (-1 < local_48 && iVar5 != 0) {
    uVar6 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if ((int)uVar6 < local_48) {
      pcVar15 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "Not enough parameters for \'%s\' (expected %d, got %d)";
    }
    else {
      if ((int)uVar6 <= local_5c) {
        if (((ctx->Function == (PFunction *)0x0) ||
            ((((ctx->Function->Variants).Array)->Flags & 2) == 0)) ||
           (bVar4 = DObject::IsKindOf((DObject *)ctx->Class,PClassActor::RegistrationInfo.MyClass),
           !bVar4)) {
          this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
          FxConstant::FxConstant(this_01,sc);
        }
        else {
          this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x30);
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_0070d370;
          FScriptPosition::FScriptPosition(&(this_01->super_FxExpression).ScriptPosition,sc);
          (this_01->super_FxExpression).ValueType = (PType *)0x0;
          (this_01->super_FxExpression).isresolved = false;
          (this_01->super_FxExpression).NeedResult = true;
          (this_01->super_FxExpression).ExprType = EFX_Self;
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_0070c728;
          *(undefined1 *)&(this_01->value).Type = 0;
        }
        this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
        FxActionSpecialCall::FxActionSpecialCall
                  ((FxActionSpecialCall *)this_00,&this_01->super_FxExpression,iVar5,
                   (FArgumentList *)local_68,sc);
LAB_0053222b:
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pp_Var9 = (this_00->super_FxExpression)._vptr_FxExpression;
        goto LAB_005322d2;
      }
      pcVar15 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "too many parameters for \'%s\' (expected %d, got %d)";
    }
    FScriptPosition::Message(sc,2,message,pcVar15);
LAB_005321a5:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  local_38.Index = (this->MethodName).Index;
  pPVar10 = PClass::FindClass(&local_38);
  expr = local_68;
  if ((pPVar10 != (PClass *)0x0) && (pPVar10->bExported == true)) {
    bVar4 = CheckArgSize((FName)(this->MethodName).Index,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,1
                         ,1,sc);
    if (!bVar4) goto LAB_00532bc3;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar8 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,&pFVar8->ScriptPosition);
    (this_00->super_FxExpression).ValueType = (PType *)0x0;
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_DynamicCast;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxDynamicCast_0070c1e0;
    (((FArgumentList *)&this_00->Self)->super_TArray<FxExpression_*,_FxExpression_*>).Array =
         (FxExpression **)pFVar8;
    *(PClass **)&this_00->EmitTail = pPVar10;
    *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var9 = (this_00->super_FxExpression)._vptr_FxExpression;
    goto LAB_005322d2;
  }
  fname.Index = (this->MethodName).Index;
  lVar16 = (long)fname.Index;
  if (0x1e9 < lVar16) {
    uVar6 = fname.Index - 0x24e;
    if (uVar6 < 0x30) {
      if ((0xc00000030487U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if ((0xc00000UL >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          if ((int)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count < 2) {
            pcVar15 = FName::NameData.NameArray[lVar16].Text;
            uVar17 = 2;
            goto LAB_00532bbc;
          }
          this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
          local_3c.Index = (this->MethodName).Index;
          FxMinMax::FxMinMax((FxMinMax *)this_00,(TArray<FxExpression_*,_FxExpression_*> *)expr,
                             &local_3c,sc);
          goto LAB_00532d8d;
        }
        goto LAB_0053280e;
      }
    }
    else {
LAB_0053280e:
      if (fname.Index != 0x1ea) {
        if (fname.Index != 0x204) goto switchD_0053243a_caseD_d8;
        if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count - 3 < 2) {
          this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
          FxColorLiteral::FxColorLiteral((FxColorLiteral *)this_00,(FArgumentList *)expr,sc);
          goto LAB_00532d8d;
        }
      }
    }
    bVar4 = CheckArgSize(fname,(FArgumentList *)
                               (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.
                                      Count,1,1,sc);
    if (!bVar4) {
LAB_00532bc3:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    iVar5 = (this->MethodName).Index;
    if (iVar5 < 0x25f) {
      switch(iVar5) {
      case 0x24e:
        ppPVar12 = (PName **)&TypeSInt32;
        break;
      case 0x24f:
        ppPVar12 = (PName **)&TypeUInt32;
        break;
      case 0x250:
        ppPVar12 = (PName **)&TypeBool;
        break;
      case 0x251:
      case 0x252:
      case 0x253:
      case 0x254:
      case 0x256:
      case 599:
switchD_00532538_caseD_251:
        if (iVar5 == 0x204) {
          ppPVar12 = (PName **)&TypeColor;
        }
        else {
          ppPVar12 = (PName **)&TypeSound;
        }
        break;
      case 0x255:
      case 600:
        ppPVar12 = (PName **)&TypeFloat64;
        break;
      default:
        if (iVar5 != 0x1ea) goto switchD_00532538_caseD_251;
        ppPVar12 = &TypeName;
      }
    }
    else if (iVar5 == 0x25f) {
      ppPVar12 = (PName **)&TypeState;
    }
    else if (iVar5 == 0x27c) {
      ppPVar12 = (PName **)&TypeSpriteID;
    }
    else {
      if (iVar5 != 0x27d) goto switchD_00532538_caseD_251;
      ppPVar12 = (PName **)&TypeTextureID;
    }
    type = (PType *)*ppPVar12;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
    FxTypeCast::FxTypeCast
              ((FxTypeCast *)this_00,
               (FxExpression *)((FxExpression *)expr->Name)->_vptr_FxExpression,type,true,true);
LAB_00532d82:
    ((FxExpression *)expr->Name)->_vptr_FxExpression = (_func_int **)0x0;
    goto LAB_00532d8d;
  }
  switch(fname.Index) {
  case 0xd1:
    uVar6 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if (uVar6 != 0) {
      bVar4 = CheckArgSize((FName)0xd1,(FArgumentList *)(ulong)uVar6,2,2,sc);
      if (!bVar4) goto LAB_00532bc3;
      this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
      ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      FxRandom::FxRandom((FxRandom *)this_00,this->RNG,*ppFVar2,ppFVar2[1],sc,ctx->FromDecorate);
      goto LAB_00532ad5;
    }
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
    local_68 = this->RNG;
    pFVar8 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar8->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar8->ScriptPosition,sc);
    pFVar8->NeedResult = true;
    pFVar8->ExprType = EFX_Constant;
    pFVar8->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar3 = TypeSInt32;
    pFVar8[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
    pFVar8->ValueType = (PType *)pPVar3;
    *(undefined4 *)&pFVar8[1].ScriptPosition.FileName.Chars = 0;
    pFVar8->isresolved = true;
    pFVar13 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar13->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar13->ScriptPosition,sc);
    pFVar13->NeedResult = true;
    pFVar13->ExprType = EFX_Constant;
    pFVar13->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar3 = TypeSInt32;
    pFVar13[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
    pFVar13->ValueType = (PType *)pPVar3;
    *(undefined4 *)&pFVar13[1].ScriptPosition.FileName.Chars = 0xff;
    pFVar13->isresolved = true;
    FxRandom::FxRandom((FxRandom *)this_00,local_68,pFVar8,pFVar13,sc,ctx->FromDecorate);
    break;
  case 0xd2:
    bVar4 = CheckArgSize((FName)0xd2,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,2
                         ,2,sc);
    if (!bVar4) goto LAB_00532bc3;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
    ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    FxFRandom::FxFRandom((FxFRandom *)this_00,this->RNG,*ppFVar2,ppFVar2[1],sc);
LAB_00532ad5:
    (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[1] = (FxExpression *)0x0;
    *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
    break;
  case 0xd3:
    bVar4 = CheckArgSize((FName)0xd3,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,0
                         ,1,sc);
    if (!bVar4) goto LAB_00532bc3;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
      pFVar8 = (FxExpression *)0x0;
    }
    else {
      pFVar8 = (FxExpression *)((FxExpression *)expr->Name)->_vptr_FxExpression;
    }
    FxRandom2::FxRandom2((FxRandom2 *)this_00,this->RNG,pFVar8,sc,ctx->FromDecorate);
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) goto LAB_00532d82;
    break;
  case 0xd4:
  case 0xd5:
    if ((int)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count < 1) {
      pcVar15 = FName::NameData.NameArray[lVar16].Text;
      uVar17 = 1;
LAB_00532bbc:
      FScriptPosition::Message
                (sc,2,"Insufficient arguments in call to %s, expected %d, got %d",pcVar15,uVar17);
      goto LAB_00532bc3;
    }
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
    FxRandomPick::FxRandomPick
              ((FxRandomPick *)this_00,this->RNG,(TArray<FxExpression_*,_FxExpression_*> *)expr,
               (this->MethodName).Index == 0xd5,sc,ctx->FromDecorate);
    break;
  case 0xd6:
    bVar4 = CheckArgSize((FName)0xd6,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,0
                         ,0,sc);
    if (!bVar4) goto LAB_00532bc3;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
    puVar11 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x30);
    *puVar11 = &PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition((FScriptPosition *)(puVar11 + 1),sc);
    puVar11[3] = 0;
    *(undefined2 *)(puVar11 + 4) = 0x100;
    *(undefined4 *)((long)puVar11 + 0x24) = 0x24;
    *puVar11 = &PTR__FxExpression_0070c728;
    *(undefined1 *)(puVar11 + 5) = 0;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,(FScriptPosition *)(puVar11 + 1));
    (this_00->super_FxExpression).ValueType = (PType *)0x0;
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_GetClass;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_0070cc70;
    *(undefined8 **)&this_00->EmitTail = puVar11;
    break;
  case 0xd7:
    bVar4 = CheckArgSize((FName)0xd7,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,1
                         ,1,sc);
    if (!bVar4) goto LAB_00532bc3;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
    pp_Var9 = ((FxExpression *)expr->Name)->_vptr_FxExpression;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_00->super_FxExpression).ScriptPosition,(FScriptPosition *)(pp_Var9 + 1));
    (this_00->super_FxExpression).ValueType = (PType *)0x0;
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_GetDefaultByType;
    (this_00->super_FxExpression)._vptr_FxExpression =
         (_func_int **)&PTR__FxGetDefaultByType_0070ccd8;
    *(_func_int ***)&this_00->EmitTail = pp_Var9;
    pFVar8 = (FxExpression *)expr->Name;
    goto LAB_00532906;
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
switchD_0053243a_caseD_d8:
    FScriptPosition::Message
              (sc,2,"Call to unknown function \'%s\'",FName::NameData.NameArray[lVar16].Text);
    goto LAB_00532bc3;
  case 0xe4:
  case 0xe5:
    bVar4 = CheckArgSize(fname,(FArgumentList *)
                               (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.
                                      Count,2,2,sc);
    if (!bVar4) goto LAB_00532bc3;
    bVar4 = (this->MethodName).Index == 0xe4;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
    ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    pFVar8 = ppFVar2[!bVar4];
    pFVar13 = ppFVar2[bVar4];
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&(this_00->super_FxExpression).ScriptPosition,sc);
    (this_00->super_FxExpression).ValueType = (PType *)0x0;
    (this_00->super_FxExpression).isresolved = false;
    (this_00->super_FxExpression).NeedResult = true;
    (this_00->super_FxExpression).ExprType = EFX_ATan2;
    (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxATan2_0070c318;
    *(FxExpression **)&this_00->EmitTail = pFVar8;
    (((FArgumentList *)&this_00->Self)->super_TArray<FxExpression_*,_FxExpression_*>).Array =
         (FxExpression **)pFVar13;
    (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[1] = (FxExpression *)0x0;
    pFVar8 = (FxExpression *)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
LAB_00532906:
    pFVar8->_vptr_FxExpression = (_func_int **)0x0;
    break;
  default:
    if (fname.Index == 0xfa) {
      bVar4 = CheckArgSize((FName)0xfa,
                           (FArgumentList *)
                           (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count
                           ,1,1,sc);
      if (!bVar4) goto LAB_00532bc3;
      this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
      FxAbs::FxAbs((FxAbs *)this_00,(FxExpression *)((FxExpression *)expr->Name)->_vptr_FxExpression
                  );
      goto LAB_00532d82;
    }
    if (fname.Index != 0x10b) goto switchD_0053243a_caseD_d8;
    bVar4 = CheckArgSize((FName)0x10b,
                         (FArgumentList *)
                         (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count,3
                         ,3,sc);
    if (!bVar4) goto LAB_00532bc3;
    local_58.Array = (FxExpression **)0x0;
    local_58.Most = 0;
    local_58.Count = 0;
    TArray<FxExpression_*,_FxExpression_*>::Grow(&local_58,2);
    local_58.Count = 2;
    *local_58.Array = (FxExpression *)((FxExpression *)expr->Name)->_vptr_FxExpression;
    local_58.Array[1] =
         (FxExpression *)(((FxExpression *)expr->Name)->ScriptPosition).FileName.Chars;
    this_02 = (FxMinMax *)FMemArena::Alloc(&FxAlloc,0x40);
    local_40.Index = 0x265;
    FxMinMax::FxMinMax(this_02,&local_58,&local_40,sc);
    *local_58.Array = (FxExpression *)this_02;
    local_58.Array[1] = *(FxExpression **)&(((FxExpression *)expr->Name)->ScriptPosition).ScriptLine
    ;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
    local_44.Index = 0x264;
    FxMinMax::FxMinMax((FxMinMax *)this_00,&local_58,&local_44,sc);
    *(undefined8 *)&(((FxExpression *)expr->Name)->ScriptPosition).ScriptLine = 0;
    (((FxExpression *)expr->Name)->ScriptPosition).FileName.Chars = (char *)0x0;
    ((FxExpression *)expr->Name)->_vptr_FxExpression = (_func_int **)0x0;
    TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_58);
  }
LAB_00532d8d:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  pp_Var9 = (this_00->super_FxExpression)._vptr_FxExpression;
LAB_005322d2:
  iVar5 = (*pp_Var9[2])(this_00,ctx);
  return (FxExpression *)CONCAT44(extraout_var,iVar5);
}

Assistant:

FxExpression *FxFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	bool error = false;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	PFunction *afd = FindClassMemberFunction(ctx.Class, ctx.Class, MethodName, ScriptPosition, &error);

	if (afd != nullptr)
	{
		if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
		{
			delete this;
			return nullptr;
		}

		auto self = (afd->Variants[0].Flags & VARF_Method)? new FxSelf(ScriptPosition) : nullptr;
		auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, false);
		delete this;
		return x->Resolve(ctx);
	}

	for (size_t i = 0; i < countof(FxFlops); ++i)
	{
		if (MethodName == FxFlops[i].Name)
		{
			FxExpression *x = new FxFlopFunctionCall(i, ArgList, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	int min, max, special;
	if (MethodName == NAME_ACS_NamedExecuteWithResult || MethodName == NAME_CallACS)
	{
		special = -ACS_ExecuteWithResult;
		min = 1;
		max = 5;
	}
	else
	{
		special = P_FindLineSpecial(MethodName.GetChars(), &min, &max);
	}
	if (special != 0 && min >= 0)
	{
		int paramcount = ArgList.Size();
		if (paramcount < min)
		{
			ScriptPosition.Message(MSG_ERROR, "Not enough parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), min, paramcount);
			delete this;
			return nullptr;
		}
		else if (paramcount > max)
		{
			ScriptPosition.Message(MSG_ERROR, "too many parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), max, paramcount);
			delete this;
			return nullptr;
		}
		FxExpression *self = (ctx.Function && (ctx.Function->Variants[0].Flags & VARF_Method) && ctx.Class->IsKindOf(RUNTIME_CLASS(PClassActor))) ? new FxSelf(ScriptPosition) : (FxExpression*)new FxConstant(ScriptPosition);
		FxExpression *x = new FxActionSpecialCall(self, special, ArgList, ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	PClass *cls = PClass::FindClass(MethodName);
	if (cls != nullptr && cls->bExported)
	{
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			FxExpression *x = new FxDynamicCast(cls, ArgList[0]);
			ArgList[0] = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			delete this;
			return nullptr;
		}
	}


	// Last but not least: Check builtins and type casts. The random functions can take a named RNG if specified.
	// Note that for all builtins the used arguments have to be nulled in the ArgList so that they won't get deleted before they get used.
	FxExpression *func = nullptr;

	switch (MethodName)
	{
	case NAME_Color:
		if (ArgList.Size() == 3 || ArgList.Size() == 4)
		{
			func = new FxColorLiteral(ArgList, ScriptPosition);
			break;
		}
		// fall through
	case NAME_Bool:
	case NAME_Int:
	case NAME_uInt:
	case NAME_Float:
	case NAME_Double:
	case NAME_Name:
	case NAME_Sound:
	case NAME_State:
	case NAME_SpriteID:
	case NAME_TextureID:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			PType *type = 
				MethodName == NAME_Bool ? TypeBool :
				MethodName == NAME_Int ? TypeSInt32 :
				MethodName == NAME_uInt ? TypeUInt32 :
				MethodName == NAME_Float ? TypeFloat64 :
				MethodName == NAME_Double ? TypeFloat64 :
				MethodName == NAME_Name ? TypeName :
				MethodName == NAME_SpriteID ? TypeSpriteID :
				MethodName == NAME_TextureID ? TypeTextureID :
				MethodName == NAME_State ? TypeState :
				MethodName == NAME_Color ? TypeColor : (PType*)TypeSound;

			func = new FxTypeCast(ArgList[0], type, true, true);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_GetClass:
		if (CheckArgSize(NAME_GetClass, ArgList, 0, 0, ScriptPosition))
		{
			func = new FxGetClass(new FxSelf(ScriptPosition));
		}
		break;

	case NAME_GetDefaultByType:
		if (CheckArgSize(NAME_GetDefaultByType, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxGetDefaultByType(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_Random:
		// allow calling Random without arguments to default to (0, 255)
		if (ArgList.Size() == 0)
		{
			func = new FxRandom(RNG, new FxConstant(0, ScriptPosition), new FxConstant(255, ScriptPosition), ScriptPosition, ctx.FromDecorate);
		}
		else if (CheckArgSize(NAME_Random, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxRandom(RNG, ArgList[0], ArgList[1], ScriptPosition, ctx.FromDecorate);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_FRandom:
		if (CheckArgSize(NAME_FRandom, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxFRandom(RNG, ArgList[0], ArgList[1], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_RandomPick:
	case NAME_FRandomPick:
		if (CheckArgSize(MethodName, ArgList, 1, -1, ScriptPosition))
		{
			func = new FxRandomPick(RNG, ArgList, MethodName == NAME_FRandomPick, ScriptPosition, ctx.FromDecorate);
		}
		break;

	case NAME_Random2:
		if (CheckArgSize(NAME_Random2, ArgList, 0, 1, ScriptPosition))
		{
			func = new FxRandom2(RNG, ArgList.Size() == 0? nullptr : ArgList[0], ScriptPosition, ctx.FromDecorate);
			if (ArgList.Size() > 0) ArgList[0] = nullptr;
		}
		break;

	case NAME_Min:
	case NAME_Max:
		if (CheckArgSize(MethodName, ArgList, 2, -1, ScriptPosition))
		{
			func = new FxMinMax(ArgList, MethodName, ScriptPosition);
		}
		break;

	case NAME_Clamp:
		if (CheckArgSize(MethodName, ArgList, 3, 3, ScriptPosition))
		{
			TArray<FxExpression *> pass;
			pass.Resize(2);
			pass[0] = ArgList[0];
			pass[1] = ArgList[1];
			pass[0] = new FxMinMax(pass, NAME_Max, ScriptPosition);
			pass[1] = ArgList[2];
			func = new FxMinMax(pass, NAME_Min, ScriptPosition);
			ArgList[0] = ArgList[1] = ArgList[2] = nullptr;
		}
		break;

	case NAME_Abs:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxAbs(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_ATan2:
	case NAME_VectorAngle:
		if (CheckArgSize(MethodName, ArgList, 2, 2, ScriptPosition))
		{
			func = MethodName == NAME_ATan2 ? new FxATan2(ArgList[0], ArgList[1], ScriptPosition) : new FxATan2(ArgList[1], ArgList[0], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Call to unknown function '%s'", MethodName.GetChars());
		break;
	}
	if (func != nullptr)
	{
		delete this;
		return func->Resolve(ctx);
	}
	delete this;
	return nullptr;
}